

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

Var __thiscall Js::JavascriptStackWalker::GetCurrentArgumentsObject(JavascriptStackWalker *this)

{
  Var pvVar1;
  
  if (this->interpreterFrame != (InterpreterStackFrame *)0x0) {
    return *(Var *)(this->interpreterFrame + 0x40);
  }
  if ((this->field_0x50 & 1) != 0) {
    pvVar1 = InlinedFrameWalker::GetArgumentsObject(&this->inlinedFrameWalker);
    return pvVar1;
  }
  pvVar1 = GetCurrentNativeArgumentsObject(this);
  return pvVar1;
}

Assistant:

Var JavascriptStackWalker::GetCurrentArgumentsObject() const
    {
#if ENABLE_PROFILE_INFO
        if (interpreterFrame)
#else
        Assert(interpreterFrame);
#endif
        {
            return interpreterFrame->GetArgumentsObject();
        }
#if ENABLE_NATIVE_CODEGEN
        else
        {
            if (inlinedFramesBeingWalked)
            {
                return inlinedFrameWalker.GetArgumentsObject();
            }
            else
            {
                return this->GetCurrentNativeArgumentsObject();
            }
        }
#endif
    }